

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,REF_DBL *hessian)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_DBL *m;
  long lVar6;
  undefined1 local_68 [3] [16];
  
  iVar2 = *(int *)((long)&ref_grid->mpi + 4);
  if (0 < iVar2) {
    lVar6 = 0;
    m = hessian;
    do {
      if ((-1 < *(long *)(&ref_grid->cell[0]->type + lVar6 * 2)) &&
         (ref_grid->cell[8]->last_node_is_an_id == (&ref_grid->cell[3]->type)[lVar6])) {
        uVar3 = ref_matrix_diag_m2(m,(REF_DBL *)local_68);
        if (uVar3 != 0) {
          pcVar5 = "decomp";
          uVar4 = 0x658;
          goto LAB_001cea8f;
        }
        auVar1._8_8_ = local_68[0]._8_8_ ^ 0x8000000000000000;
        auVar1._0_8_ = local_68[0]._0_8_ ^ 0x8000000000000000;
        local_68[0] = maxpd(local_68[0],auVar1);
        uVar3 = ref_matrix_form_m2((REF_DBL *)local_68,m);
        if (uVar3 != 0) {
          pcVar5 = "re-form";
          uVar4 = 0x65b;
          goto LAB_001cea8f;
        }
        iVar2 = *(int *)((long)&ref_grid->mpi + 4);
      }
      lVar6 = lVar6 + 1;
      m = m + 3;
    } while (lVar6 < iVar2);
  }
  uVar3 = ref_node_ghost_dbl((REF_NODE)ref_grid,hessian,3);
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    pcVar5 = "update ghosts";
    uVar4 = 0x65f;
LAB_001cea8f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar4,
           "ref_recon_abs_value_hessian2",(ulong)uVar3,pcVar5);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,
                                                       REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[6];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m2(&(hessian[3 * node]), diag_system), "decomp");
      ref_matrix_eig2(diag_system, 0) = ABS(ref_matrix_eig2(diag_system, 0));
      ref_matrix_eig2(diag_system, 1) = ABS(ref_matrix_eig2(diag_system, 1));
      RSS(ref_matrix_form_m2(diag_system, &(hessian[3 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  return REF_SUCCESS;
}